

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O0

void wabt::interp::WriteValues(Stream *stream,ValueTypes *types,Values *values)

{
  ulong uVar1;
  ValueTypes *stream_00;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  TypedValue local_40;
  ulong local_28;
  size_t i;
  Values *values_local;
  ValueTypes *types_local;
  Stream *stream_local;
  
  i = (size_t)values;
  values_local = (Values *)types;
  types_local = (ValueTypes *)stream;
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  sVar3 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                    ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i);
  if (sVar2 == sVar3) {
    local_28 = 0;
    while( true ) {
      uVar1 = local_28;
      sVar2 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                        ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i);
      stream_00 = types_local;
      if (sVar2 <= uVar1) break;
      pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)values_local,local_28);
      local_40.type = *pvVar4;
      pvVar5 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                         ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i,
                          local_28);
      local_40.value.field_0.i64_ = (pvVar5->field_0).i64_;
      local_40.value.field_0._8_8_ = *(undefined8 *)((long)&pvVar5->field_0 + 8);
      WriteValue((Stream *)stream_00,&local_40);
      uVar1 = local_28;
      sVar2 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                        ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i);
      if (uVar1 != sVar2 - 1) {
        Stream::Writef((Stream *)types_local,", ");
      }
      local_28 = local_28 + 1;
    }
    return;
  }
  __assert_fail("types.size() == values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-util.cc"
                ,0x54,"void wabt::interp::WriteValues(Stream *, const ValueTypes &, const Values &)"
               );
}

Assistant:

void WriteValues(Stream* stream,
                 const ValueTypes& types,
                 const Values& values) {
  assert(types.size() == values.size());
  for (size_t i = 0; i < values.size(); ++i) {
    WriteValue(stream, TypedValue{types[i], values[i]});
    if (i != values.size() - 1) {
      stream->Writef(", ");
    }
  }
}